

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column.h
# Opt level: O2

bool __thiscall
Gudhi::persistence_matrix::
List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>
::
_add<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>
          (List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>
           *this,List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
                 *column)

{
  Column_support *pCVar1;
  List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>
  *this_00;
  _List_node_base *p_Var2;
  bool bVar3;
  _Self __tmp;
  _List_node_base *p_Var4;
  const_iterator __end0;
  iterator local_30;
  
  pCVar1 = &column->column_;
  if ((column->column_).
      super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>_>
      ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)pCVar1) {
    bVar3 = false;
  }
  else {
    this_00 = this + 0x18;
    if (*(List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>
          **)(this + 0x18) != this_00) {
      bVar3 = _add_to_column<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>,Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,false>>>>
                        (column,(List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
                                 *)this);
      return bVar3;
    }
    std::__cxx11::
    list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>_>
    ::resize((list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>_>
              *)this_00,
             (column->column_).
             super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>_>
             ._M_impl._M_node._M_size);
    local_30._M_node = *(_List_node_base **)this_00;
    p_Var4 = (_List_node_base *)pCVar1;
    while (p_Var4 = (((_List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>_*>_>
                       *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var4 != (_List_node_base *)pCVar1) {
      p_Var2 = (local_30._M_node)->_M_next;
      List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
      ::_update_entry((List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_false>_>_>
                       *)this,(Field_element *)((long)p_Var4[1]._M_next + 4),
                      *(ID_index *)((long)p_Var4[1]._M_next + 8),&local_30);
      local_30._M_node = p_Var2;
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

inline typename List_column<Master_matrix>::const_iterator List_column<Master_matrix>::begin() const noexcept
{
  return column_.begin();
}